

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void parse_fn(Parser *psr)

{
  int iVar1;
  uint64_t name;
  int iVar2;
  BcIns ins;
  Function *fn;
  uint8_t slot;
  int fn_idx;
  uint64_t fn_name;
  Parser *psr_local;
  
  lex_next(&psr->lxr);
  lex_expect(&psr->lxr,0x114);
  name = (psr->lxr).tk.field_4.ident_hash;
  lex_next(&psr->lxr);
  iVar2 = parse_fn_args_body(psr);
  psr_new_local(psr,name);
  iVar1 = psr->scope->next_slot;
  psr->scope->next_slot = iVar1 + 1;
  fn = psr_fn(psr);
  ins = bc_new2(BC_SET_F,(uint8_t)iVar1,(uint16_t)iVar2);
  fn_emit(fn,ins);
  return;
}

Assistant:

static void parse_fn(Parser *psr) {
	// Skip the `fn` token
	lex_next(&psr->lxr);

	// Expect the name of the function
	lex_expect(&psr->lxr, TK_IDENT);
	uint64_t fn_name = psr->lxr.tk.ident_hash;
	lex_next(&psr->lxr);

	// Parse the arguments and function body
	int fn_idx = parse_fn_args_body(psr);

	// Create a new local in the outer scope containing the new function
	psr_new_local(psr, fn_name);
	uint8_t slot = (uint8_t) psr->scope->next_slot++;
	fn_emit(psr_fn(psr), bc_new2(BC_SET_F, slot, (uint16_t) fn_idx));
}